

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfMan.c
# Opt level: O2

int Cnf_DataWriteOrClause(void *p,Cnf_Dat_t *pCnf)

{
  int iVar1;
  lit *begin;
  void *pvVar2;
  long lVar3;
  Aig_Man_t *pAVar4;
  
  pAVar4 = pCnf->pMan;
  begin = (lit *)malloc((long)pAVar4->nObjs[3] << 2);
  for (lVar3 = 0; lVar3 < pAVar4->vCos->nSize; lVar3 = lVar3 + 1) {
    pvVar2 = Vec_PtrEntry(pAVar4->vCos,(int)lVar3);
    begin[lVar3] = pCnf->pVarNums[*(int *)((long)pvVar2 + 0x24)] * 2;
    pAVar4 = pCnf->pMan;
  }
  iVar1 = sat_solver_addclause((sat_solver *)p,begin,begin + pAVar4->nObjs[3]);
  free(begin);
  return (int)(iVar1 != 0);
}

Assistant:

int Cnf_DataWriteOrClause( void * p, Cnf_Dat_t * pCnf )
{
    sat_solver * pSat = (sat_solver *)p;
    Aig_Obj_t * pObj;
    int i, * pLits;
    pLits = ABC_ALLOC( int, Aig_ManCoNum(pCnf->pMan) );
    Aig_ManForEachCo( pCnf->pMan, pObj, i )
        pLits[i] = toLitCond( pCnf->pVarNums[pObj->Id], 0 );
    if ( !sat_solver_addclause( pSat, pLits, pLits + Aig_ManCoNum(pCnf->pMan) ) )
    {
        ABC_FREE( pLits );
        return 0;
    }
    ABC_FREE( pLits );
    return 1;
}